

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O0

int * __thiscall
pbrt::BufferCache<int>::LookupOrAdd(BufferCache<int> *this,span<const_int> buf,Allocator alloc)

{
  int *piVar1;
  bool bVar2;
  Buffer *this_00;
  size_t sVar3;
  pointer pBVar4;
  long in_RDI;
  long *in_FS_OFFSET;
  int *cachePtr;
  iterator iter_1;
  int *ptr;
  int *ptr_1;
  iterator iter;
  int shardIndex;
  Buffer lookupBuffer;
  unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
  *in_stack_ffffffffffffff28;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff30;
  value_type *in_stack_ffffffffffffff38;
  Buffer *in_stack_ffffffffffffff40;
  _Node_iterator_base<pbrt::BufferCache<int>::Buffer,_true> local_78;
  _Node_iterator_base<pbrt::BufferCache<int>::Buffer,_true> local_70;
  int *local_68;
  int *local_60;
  _Node_iterator_base<pbrt::BufferCache<int>::Buffer,_true> local_58;
  _Node_iterator_base<pbrt::BufferCache<int>::Buffer,_true> local_50;
  uint local_44;
  ulong local_30;
  span<const_int> local_18;
  int *local_8;
  
  *(long *)(*in_FS_OFFSET + -0x290) = *(long *)(*in_FS_OFFSET + -0x290) + 1;
  pstd::span<const_int>::data(&local_18);
  pstd::span<const_int>::size(&local_18);
  Buffer::Buffer(in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,
                 (size_t)in_stack_ffffffffffffff30);
  local_44 = (uint)(local_30 >> 0x1a) & 0x3f;
  std::shared_mutex::lock_shared((shared_mutex *)0x744d2f);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x744d57);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
       ::end(in_stack_ffffffffffffff28);
  bVar2 = std::__detail::operator!=(&local_50,&local_58);
  if (bVar2) {
    pBVar4 = std::__detail::_Node_iterator<pbrt::BufferCache<int>::Buffer,_true,_true>::operator->
                       ((_Node_iterator<pbrt::BufferCache<int>::Buffer,_true,_true> *)0x744db2);
    local_60 = pBVar4->ptr;
    std::shared_mutex::unlock_shared((shared_mutex *)0x744dd3);
    *(long *)(*in_FS_OFFSET + -0x298) = *(long *)(*in_FS_OFFSET + -0x298) + 1;
    sVar3 = pstd::span<const_int>::size(&local_18);
    *(long *)(*in_FS_OFFSET + -0x2a0) = sVar3 * 4 + *(long *)(*in_FS_OFFSET + -0x2a0);
    local_8 = local_60;
  }
  else {
    std::shared_mutex::unlock_shared((shared_mutex *)0x744e44);
    pstd::span<const_int>::size(&local_18);
    local_68 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<int>
                         (in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
    this_00 = (Buffer *)pstd::span<const_int>::begin(&local_18);
    pstd::span<const_int>::end(&local_18);
    std::copy<int_const*,int*>
              ((int *)this_00,(int *)in_stack_ffffffffffffff38,(int *)in_stack_ffffffffffffff30);
    sVar3 = pstd::span<const_int>::size(&local_18);
    std::__atomic_base<unsigned_long>::operator+=
              ((__atomic_base<unsigned_long> *)(in_RDI + 0x1c00),sVar3 << 2);
    std::shared_mutex::lock((shared_mutex *)0x744ed5);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
         ::find(in_stack_ffffffffffffff28,(key_type *)0x744efd);
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
         ::end(in_stack_ffffffffffffff28);
    bVar2 = std::__detail::operator!=(&local_70,&local_78);
    if (bVar2) {
      pBVar4 = std::__detail::_Node_iterator<pbrt::BufferCache<int>::Buffer,_true,_true>::operator->
                         ((_Node_iterator<pbrt::BufferCache<int>::Buffer,_true,_true> *)0x744f49);
      piVar1 = pBVar4->ptr;
      std::shared_mutex::unlock((shared_mutex *)0x744f6a);
      pstd::span<const_int>::size(&local_18);
      pstd::pmr::polymorphic_allocator<std::byte>::deallocate_object<int>
                (in_stack_ffffffffffffff30,(int *)in_stack_ffffffffffffff28,0x744f96);
      *(long *)(*in_FS_OFFSET + -0x298) = *(long *)(*in_FS_OFFSET + -0x298) + 1;
      sVar3 = pstd::span<const_int>::size(&local_18);
      *(long *)(*in_FS_OFFSET + -0x2a0) = sVar3 * 4 + *(long *)(*in_FS_OFFSET + -0x2a0);
      local_8 = piVar1;
    }
    else {
      sVar3 = in_RDI + 0xe00 + (long)(int)local_44 * 0x38;
      pstd::span<const_int>::size(&local_18);
      Buffer::Buffer(this_00,(int *)in_stack_ffffffffffffff38,sVar3);
      std::
      unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
      ::insert((unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
                *)this_00,in_stack_ffffffffffffff38);
      std::shared_mutex::unlock((shared_mutex *)0x745063);
      local_8 = local_68;
    }
  }
  return local_8;
}

Assistant:

const T *LookupOrAdd(pstd::span<const T> buf, Allocator alloc) {
        ++nBufferCacheLookups;
        // Return pointer to data if _buf_ contents are already in the cache
        Buffer lookupBuffer(buf.data(), buf.size());
        int shardIndex = uint32_t(lookupBuffer.hash) >> (32 - logShards);
        DCHECK(shardIndex >= 0 && shardIndex < nShards);
        mutex[shardIndex].lock_shared();
        if (auto iter = cache[shardIndex].find(lookupBuffer);
            iter != cache[shardIndex].end()) {
            const T *ptr = iter->ptr;
            mutex[shardIndex].unlock_shared();
            DCHECK(std::memcmp(buf.data(), iter->ptr, buf.size() * sizeof(T)) == 0);
            ++nBufferCacheHits;
            redundantBufferBytes += buf.size() * sizeof(T);
            return ptr;
        }

        // Add _buf_ contents to cache and return pointer to cached copy
        mutex[shardIndex].unlock_shared();
        T *ptr = alloc.allocate_object<T>(buf.size());
        std::copy(buf.begin(), buf.end(), ptr);
        bytesUsed += buf.size() * sizeof(T);
        mutex[shardIndex].lock();
        // Handle the case of another thread adding the buffer first
        if (auto iter = cache[shardIndex].find(lookupBuffer);
            iter != cache[shardIndex].end()) {
            const T *cachePtr = iter->ptr;
            mutex[shardIndex].unlock();
            alloc.deallocate_object(ptr, buf.size());
            ++nBufferCacheHits;
            redundantBufferBytes += buf.size() * sizeof(T);
            return cachePtr;
        }

        cache[shardIndex].insert(Buffer(ptr, buf.size()));
        mutex[shardIndex].unlock();
        return ptr;
    }